

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O1

idx_t duckdb::TemplatedMatch<false,duckdb::interval_t,duckdb::NotDistinctFrom>
                (Vector *param_1,TupleDataVectorFormat *lhs_format,SelectionVector *sel,idx_t count,
                TupleDataLayout *rhs_layout,Vector *rhs_row_locations,idx_t col_idx,
                vector<duckdb::MatchFunction,_true> *param_8,SelectionVector *no_match_sel,
                idx_t *no_match_count)

{
  unsigned_long *puVar1;
  SelectionVector *pSVar2;
  data_ptr_t pdVar3;
  data_ptr_t pdVar4;
  value_type vVar5;
  sel_t *psVar6;
  sel_t *psVar7;
  long lVar8;
  long lVar9;
  const_reference pvVar10;
  idx_t iVar11;
  uint uVar12;
  idx_t iVar13;
  int *piVar14;
  long lVar15;
  idx_t iVar16;
  long lVar17;
  bool bVar18;
  uchar **rhs_locations;
  value_type rhs_offset_in_row;
  interval_t *lhs_data;
  idx_t local_70;
  
  puVar1 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask;
  pSVar2 = (lhs_format->unified).sel;
  pdVar3 = (lhs_format->unified).data;
  pdVar4 = rhs_row_locations->data;
  pvVar10 = vector<unsigned_long,_true>::operator[](&rhs_layout->offsets,col_idx);
  vVar5 = *pvVar10;
  if (puVar1 == (unsigned_long *)0x0) {
    if (count != 0) {
      psVar6 = sel->sel_vector;
      psVar7 = pSVar2->sel_vector;
      local_70 = 0;
      iVar16 = 0;
      do {
        iVar11 = iVar16;
        if (psVar6 != (sel_t *)0x0) {
          iVar11 = (idx_t)psVar6[iVar16];
        }
        iVar13 = iVar11;
        if (psVar7 != (sel_t *)0x0) {
          iVar13 = (idx_t)psVar7[iVar11];
        }
        lVar8 = *(long *)(pdVar4 + iVar11 * 8);
        if ((1 << ((byte)col_idx & 7) & (uint)*(byte *)(lVar8 + (col_idx >> 3))) != 0) {
          piVar14 = (int *)(pdVar3 + iVar13 * 0x10);
          lVar9 = *(long *)(lVar8 + vVar5);
          lVar8 = *(long *)(lVar8 + 8 + vVar5);
          if (((*piVar14 != (int)lVar9) || (piVar14[1] != (int)((ulong)lVar9 >> 0x20))) ||
             (*(long *)(piVar14 + 2) != lVar8)) {
            lVar15 = (long)piVar14[1] + *(long *)(piVar14 + 2) / 86400000000;
            lVar17 = (lVar9 >> 0x20) + lVar8 / 86400000000;
            if ((((long)*piVar14 + lVar15 / 0x1e != (long)(int)lVar9 + lVar17 / 0x1e) ||
                (lVar15 % 0x1e != lVar17 % 0x1e)) ||
               (*(long *)(piVar14 + 2) % 86400000000 != lVar8 % 86400000000)) goto LAB_012c6514;
          }
          psVar6[local_70] = (sel_t)iVar11;
          local_70 = local_70 + 1;
        }
LAB_012c6514:
        iVar16 = iVar16 + 1;
        if (count == iVar16) {
          return local_70;
        }
      } while( true );
    }
  }
  else if (count != 0) {
    psVar6 = sel->sel_vector;
    psVar7 = pSVar2->sel_vector;
    puVar1 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
    ;
    local_70 = 0;
    iVar16 = 0;
    do {
      iVar11 = iVar16;
      if (psVar6 != (sel_t *)0x0) {
        iVar11 = (idx_t)psVar6[iVar16];
      }
      iVar13 = iVar11;
      if (psVar7 != (sel_t *)0x0) {
        iVar13 = (idx_t)psVar7[iVar11];
      }
      if (puVar1 == (unsigned_long *)0x0) {
        bVar18 = false;
      }
      else {
        bVar18 = (puVar1[iVar13 >> 6] >> (iVar13 & 0x3f) & 1) == 0;
      }
      lVar8 = *(long *)(pdVar4 + iVar11 * 8);
      uVar12 = (uint)*(byte *)(lVar8 + (col_idx >> 3)) & 1 << ((byte)col_idx & 7);
      if ((bVar18) || (uVar12 == 0)) {
        bVar18 = (bool)(bVar18 ^ uVar12 == 0);
LAB_012c6336:
        if (!bVar18) {
LAB_012c633a:
          psVar6[local_70] = (sel_t)iVar11;
          local_70 = local_70 + 1;
        }
      }
      else {
        piVar14 = (int *)(pdVar3 + iVar13 * 0x10);
        lVar9 = *(long *)(lVar8 + vVar5);
        lVar8 = *(long *)(lVar8 + 8 + vVar5);
        if (((*piVar14 == (int)lVar9) && (piVar14[1] == (int)((ulong)lVar9 >> 0x20))) &&
           (*(long *)(piVar14 + 2) == lVar8)) goto LAB_012c633a;
        lVar15 = (long)piVar14[1] + *(long *)(piVar14 + 2) / 86400000000;
        lVar17 = (lVar9 >> 0x20) + lVar8 / 86400000000;
        if (((long)*piVar14 + lVar15 / 0x1e == (long)(int)lVar9 + lVar17 / 0x1e) &&
           (lVar15 % 0x1e == lVar17 % 0x1e)) {
          bVar18 = *(long *)(piVar14 + 2) % 86400000000 != lVar8 % 86400000000;
          goto LAB_012c6336;
        }
      }
      iVar16 = iVar16 + 1;
      if (count == iVar16) {
        return local_70;
      }
    } while( true );
  }
  return 0;
}

Assistant:

static idx_t TemplatedMatch(Vector &, const TupleDataVectorFormat &lhs_format, SelectionVector &sel, const idx_t count,
                            const TupleDataLayout &rhs_layout, Vector &rhs_row_locations, const idx_t col_idx,
                            const vector<MatchFunction> &, SelectionVector *no_match_sel, idx_t &no_match_count) {
	if (lhs_format.unified.validity.AllValid()) {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, true>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                     col_idx, no_match_sel, no_match_count);
	} else {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, false>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                      col_idx, no_match_sel, no_match_count);
	}
}